

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmElementSegment.cpp
# Opt level: O0

void __thiscall
Wasm::WasmElementSegment::WasmElementSegment
          (WasmElementSegment *this,ArenaAllocator *alloc,uint32 index,WasmNode initExpr,
          uint32 numElem)

{
  uint32 numElem_local;
  uint32 index_local;
  ArenaAllocator *alloc_local;
  WasmElementSegment *this_local;
  
  this->m_alloc = alloc;
  this->m_index = index;
  (this->m_offsetExpr).op = initExpr.op;
  *(undefined6 *)&(this->m_offsetExpr).field_0x2 = initExpr._2_6_;
  (this->m_offsetExpr).field_1.block = initExpr.field_1.block;
  (this->m_offsetExpr).field_1.brTable.targetTable = initExpr.field_1.brTable.targetTable;
  *(undefined8 *)((long)&(this->m_offsetExpr).field_1 + 0x10) = initExpr.field_1._16_8_;
  this->m_numElem = numElem;
  this->m_offset = 0;
  this->m_elemIdx = 0;
  this->m_elems = (uint32 *)0x0;
  return;
}

Assistant:

WasmElementSegment::WasmElementSegment(ArenaAllocator* alloc, const uint32 index, const WasmNode initExpr, const uint32 numElem) :
        m_alloc(alloc),
        m_index(index),
        m_offsetExpr(initExpr),
        m_numElem(numElem),
        m_offset(0),
        m_elemIdx(0),
        m_elems(nullptr)
    {}